

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int amqpvalue_get_open(AMQP_VALUE value,OPEN_HANDLE *open_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  OPEN_HANDLE pOVar3;
  AMQP_VALUE pAVar4;
  AMQP_VALUE pAVar5;
  uint32_t list_item_count;
  char *container_id;
  AMQP_VALUE outgoing_locales_array;
  
  pOVar3 = (OPEN_HANDLE)malloc(8);
  if (pOVar3 == (OPEN_HANDLE)0x0) {
    *open_handle = (OPEN_HANDLE)0x0;
    return 0x2f9;
  }
  pOVar3->composite_value = (AMQP_VALUE)0x0;
  *open_handle = pOVar3;
  pAVar4 = amqpvalue_get_inplace_described_value(value);
  if (pAVar4 == (AMQP_VALUE)0x0) {
    open_destroy(*open_handle);
    return 0x301;
  }
  iVar1 = amqpvalue_get_list_item_count(pAVar4,&list_item_count);
  if (iVar1 != 0) {
    return 0x308;
  }
  if (list_item_count != 0) {
    pAVar5 = amqpvalue_get_list_item(pAVar4,0);
    if (pAVar5 == (AMQP_VALUE)0x0) {
      open_destroy(*open_handle);
      return 0x317;
    }
    AVar2 = amqpvalue_get_type(pAVar5);
    if (AVar2 != AMQP_TYPE_NULL) {
      iVar1 = amqpvalue_get_string(pAVar5,&container_id);
      if (iVar1 != 0) {
        amqpvalue_destroy(pAVar5);
        open_destroy(*open_handle);
        return 0x32b;
      }
      amqpvalue_destroy(pAVar5);
      if (1 < list_item_count) {
        pAVar5 = amqpvalue_get_list_item(pAVar4,1);
        if (pAVar5 != (AMQP_VALUE)0x0) {
          AVar2 = amqpvalue_get_type(pAVar5);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_string(pAVar5,&container_id), iVar1 != 0)) {
            amqpvalue_destroy(pAVar5);
            open_destroy(*open_handle);
            return 0x34d;
          }
          amqpvalue_destroy(pAVar5);
        }
        if (2 < list_item_count) {
          pAVar5 = amqpvalue_get_list_item(pAVar4,2);
          if (pAVar5 != (AMQP_VALUE)0x0) {
            AVar2 = amqpvalue_get_type(pAVar5);
            if ((AVar2 != AMQP_TYPE_NULL) &&
               (iVar1 = amqpvalue_get_uint(pAVar5,(uint32_t *)&container_id), iVar1 != 0)) {
              amqpvalue_destroy(pAVar5);
              open_destroy(*open_handle);
              return 0x36a;
            }
            amqpvalue_destroy(pAVar5);
          }
          if (3 < list_item_count) {
            pAVar5 = amqpvalue_get_list_item(pAVar4,3);
            if (pAVar5 != (AMQP_VALUE)0x0) {
              AVar2 = amqpvalue_get_type(pAVar5);
              if ((AVar2 != AMQP_TYPE_NULL) &&
                 (iVar1 = amqpvalue_get_ushort(pAVar5,(uint16_t *)&container_id), iVar1 != 0)) {
                amqpvalue_destroy(pAVar5);
                open_destroy(*open_handle);
                return 0x387;
              }
              amqpvalue_destroy(pAVar5);
            }
            if (4 < list_item_count) {
              pAVar5 = amqpvalue_get_list_item(pAVar4,4);
              if (pAVar5 != (AMQP_VALUE)0x0) {
                AVar2 = amqpvalue_get_type(pAVar5);
                if ((AVar2 != AMQP_TYPE_NULL) &&
                   (iVar1 = amqpvalue_get_uint(pAVar5,(uint32_t *)&container_id), iVar1 != 0)) {
                  amqpvalue_destroy(pAVar5);
                  open_destroy(*open_handle);
                  return 0x3a4;
                }
                amqpvalue_destroy(pAVar5);
              }
              if (5 < list_item_count) {
                pAVar5 = amqpvalue_get_list_item(pAVar4,5);
                if (pAVar5 != (AMQP_VALUE)0x0) {
                  AVar2 = amqpvalue_get_type(pAVar5);
                  if (AVar2 != AMQP_TYPE_NULL) {
                    container_id = (char *)0x0;
                    AVar2 = amqpvalue_get_type(pAVar5);
                    if (((AVar2 != AMQP_TYPE_ARRAY) ||
                        (iVar1 = amqpvalue_get_array(pAVar5,&outgoing_locales_array), iVar1 != 0))
                       && (iVar1 = amqpvalue_get_symbol(pAVar5,&container_id), iVar1 != 0)) {
                      amqpvalue_destroy(pAVar5);
                      open_destroy(*open_handle);
                      return 0x3c3;
                    }
                  }
                  amqpvalue_destroy(pAVar5);
                }
                if (6 < list_item_count) {
                  pAVar5 = amqpvalue_get_list_item(pAVar4,6);
                  if (pAVar5 != (AMQP_VALUE)0x0) {
                    AVar2 = amqpvalue_get_type(pAVar5);
                    if (AVar2 != AMQP_TYPE_NULL) {
                      container_id = (char *)0x0;
                      AVar2 = amqpvalue_get_type(pAVar5);
                      if (((AVar2 != AMQP_TYPE_ARRAY) ||
                          (iVar1 = amqpvalue_get_array(pAVar5,&outgoing_locales_array), iVar1 != 0))
                         && (iVar1 = amqpvalue_get_symbol(pAVar5,&container_id), iVar1 != 0)) {
                        amqpvalue_destroy(pAVar5);
                        open_destroy(*open_handle);
                        return 0x3e2;
                      }
                    }
                    amqpvalue_destroy(pAVar5);
                  }
                  if (7 < list_item_count) {
                    pAVar5 = amqpvalue_get_list_item(pAVar4,7);
                    if (pAVar5 != (AMQP_VALUE)0x0) {
                      AVar2 = amqpvalue_get_type(pAVar5);
                      if (AVar2 != AMQP_TYPE_NULL) {
                        container_id = (char *)0x0;
                        AVar2 = amqpvalue_get_type(pAVar5);
                        if (((AVar2 != AMQP_TYPE_ARRAY) ||
                            (iVar1 = amqpvalue_get_array(pAVar5,&outgoing_locales_array), iVar1 != 0
                            )) && (iVar1 = amqpvalue_get_symbol(pAVar5,&container_id), iVar1 != 0))
                        {
                          amqpvalue_destroy(pAVar5);
                          open_destroy(*open_handle);
                          return 0x401;
                        }
                      }
                      amqpvalue_destroy(pAVar5);
                    }
                    if (8 < list_item_count) {
                      pAVar5 = amqpvalue_get_list_item(pAVar4,8);
                      if (pAVar5 != (AMQP_VALUE)0x0) {
                        AVar2 = amqpvalue_get_type(pAVar5);
                        if (AVar2 != AMQP_TYPE_NULL) {
                          container_id = (char *)0x0;
                          AVar2 = amqpvalue_get_type(pAVar5);
                          if (((AVar2 != AMQP_TYPE_ARRAY) ||
                              (iVar1 = amqpvalue_get_array(pAVar5,&outgoing_locales_array),
                              iVar1 != 0)) &&
                             (iVar1 = amqpvalue_get_symbol(pAVar5,&container_id), iVar1 != 0)) {
                            amqpvalue_destroy(pAVar5);
                            open_destroy(*open_handle);
                            return 0x420;
                          }
                        }
                        amqpvalue_destroy(pAVar5);
                      }
                      if ((9 < list_item_count) &&
                         (pAVar4 = amqpvalue_get_list_item(pAVar4,9), pAVar4 != (AMQP_VALUE)0x0)) {
                        AVar2 = amqpvalue_get_type(pAVar4);
                        if ((AVar2 != AMQP_TYPE_NULL) &&
                           (iVar1 = amqpvalue_get_map(pAVar4,(AMQP_VALUE *)&container_id),
                           iVar1 != 0)) {
                          amqpvalue_destroy(pAVar4);
                          open_destroy(*open_handle);
                          return 0x43d;
                        }
                        amqpvalue_destroy(pAVar4);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      pAVar4 = amqpvalue_clone(value);
      pOVar3->composite_value = pAVar4;
      return 0;
    }
    amqpvalue_destroy(pAVar5);
    open_destroy(*open_handle);
    return 0x321;
  }
  return 0x335;
}

Assistant:

int amqpvalue_get_open(AMQP_VALUE value, OPEN_HANDLE* open_handle)
{
    int result;
    OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open_create_internal();
    *open_handle = open_instance;
    if (*open_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            open_destroy(*open_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* container-id */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                open_destroy(*open_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                open_destroy(*open_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                const char* container_id;
                                if (amqpvalue_get_string(item_value, &container_id) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* hostname */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* hostname;
                                if (amqpvalue_get_string(item_value, &hostname) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* max-frame-size */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint32_t max_frame_size;
                                if (amqpvalue_get_uint(item_value, &max_frame_size) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* channel-max */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint16_t channel_max;
                                if (amqpvalue_get_ushort(item_value, &channel_max) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* idle-time-out */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                milliseconds idle_time_out;
                                if (amqpvalue_get_milliseconds(item_value, &idle_time_out) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* outgoing-locales */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                ietf_language_tag outgoing_locales = NULL;
                                AMQP_VALUE outgoing_locales_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &outgoing_locales_array) != 0)) &&
                                    (amqpvalue_get_ietf_language_tag(item_value, &outgoing_locales) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* incoming-locales */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                ietf_language_tag incoming_locales = NULL;
                                AMQP_VALUE incoming_locales_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &incoming_locales_array) != 0)) &&
                                    (amqpvalue_get_ietf_language_tag(item_value, &incoming_locales) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* offered-capabilities */
                    if (list_item_count > 7)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 7);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* offered_capabilities = NULL;
                                AMQP_VALUE offered_capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &offered_capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &offered_capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* desired-capabilities */
                    if (list_item_count > 8)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 8);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* desired_capabilities = NULL;
                                AMQP_VALUE desired_capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &desired_capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &desired_capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* properties */
                    if (list_item_count > 9)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 9);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                fields properties;
                                if (amqpvalue_get_fields(item_value, &properties) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    open_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}